

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::SetPolicy(cmMakefile *this,PolicyID id,PolicyStatus status)

{
  pointer ppcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  PolicyStatus PVar5;
  PolicyStatus id_00;
  PolicyStatus extraout_EDX;
  PolicyStatus extraout_EDX_00;
  PolicyStatus extraout_EDX_01;
  PolicyStatus extraout_EDX_02;
  PolicyStatus extraout_EDX_03;
  PolicyStatus id_01;
  string msg;
  string local_90;
  string local_70;
  string local_50;
  
  id_01 = status;
  if ((status != NEW) &&
     (PVar5 = cmPolicies::GetPolicyStatus(id), id_01 = id_00, PVar5 == REQUIRED_ALWAYS)) {
    cmPolicies::GetRequiredAlwaysPolicyError_abi_cxx11_(&local_90,(cmPolicies *)(ulong)id,id_00);
    ppcVar1 = (this->ExecutionStatusStack).
              super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((this->ExecutionStatusStack).
        super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
        super__Vector_impl_data._M_start != ppcVar1) {
      ppcVar1[-1]->NestedError = true;
    }
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,&local_90,&this->Backtrace)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  if ((0x6c < (int)id || status != OLD) ||
     (((bVar3 = cmake::GetIsInTryCompile(this->GlobalGenerator->CMakeInstance), bVar3 &&
       (id - CMP0065 < 0x28)) &&
      (id_01 = extraout_EDX, (0x8004040001U >> ((ulong)(id - CMP0065) & 0x3f) & 1) != 0)))) {
    bVar2 = false;
    bVar3 = false;
    bVar4 = false;
  }
  else {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_WARN_DEPRECATED","");
    bVar3 = IsSet(this,&local_90);
    if (bVar3) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"CMAKE_WARN_DEPRECATED","");
      bVar4 = IsOn(this,&local_70);
      bVar2 = true;
      bVar3 = true;
      id_01 = extraout_EDX_01;
    }
    else {
      bVar2 = true;
      bVar3 = false;
      bVar4 = true;
      id_01 = extraout_EDX_00;
    }
  }
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    id_01 = extraout_EDX_02;
  }
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2)) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    id_01 = extraout_EDX_03;
  }
  if (bVar4 != false) {
    cmPolicies::GetPolicyDeprecatedWarning_abi_cxx11_(&local_50,(cmPolicies *)(ulong)id,id_01);
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,DEPRECATION_WARNING,&local_50,
                        &this->Backtrace);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  cmStateSnapshot::SetPolicy(&this->StateSnapshot,id,status);
  return true;
}

Assistant:

bool cmMakefile::SetPolicy(cmPolicies::PolicyID id,
                           cmPolicies::PolicyStatus status)
{
  // A REQUIRED_ALWAYS policy may be set only to NEW.
  if (status != cmPolicies::NEW &&
      cmPolicies::GetPolicyStatus(id) == cmPolicies::REQUIRED_ALWAYS) {
    std::string msg = cmPolicies::GetRequiredAlwaysPolicyError(id);
    this->IssueMessage(MessageType::FATAL_ERROR, msg);
    return false;
  }

  // Deprecate old policies.
  if (status == cmPolicies::OLD && id <= cmPolicies::CMP0108 &&
      !(this->GetCMakeInstance()->GetIsInTryCompile() &&
        (
          // Policies set by cmCoreTryCompile::TryCompileCode.
          id == cmPolicies::CMP0065 || id == cmPolicies::CMP0083 ||
          id == cmPolicies::CMP0091 || id == cmPolicies::CMP0104)) &&
      (!this->IsSet("CMAKE_WARN_DEPRECATED") ||
       this->IsOn("CMAKE_WARN_DEPRECATED"))) {
    this->IssueMessage(MessageType::DEPRECATION_WARNING,
                       cmPolicies::GetPolicyDeprecatedWarning(id));
  }

  this->StateSnapshot.SetPolicy(id, status);
  return true;
}